

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_namer.h
# Opt level: O2

string * __thiscall
flatbuffers::IdlNamer::NamespacedString
          (string *__return_storage_ptr__,IdlNamer *this,Namespace *ns,string *str)

{
  string ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38 [32];
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if (ns != (Namespace *)0x0) {
    (*(this->super_Namer)._vptr_Namer[10])(local_38);
    std::__cxx11::string::append((string *)&local_58);
    std::__cxx11::string::~string(local_38);
    if (local_58._M_string_length != 0) {
      std::__cxx11::string::append((string *)&local_58);
    }
  }
  std::operator+(__return_storage_ptr__,&local_58,str);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string NamespacedString(const struct Namespace *ns,
                               const std::string &str) const {
    std::string ret;
    if (ns != nullptr) { ret += Namespace(ns->components); }
    if (!ret.empty()) ret += config_.namespace_seperator;
    return ret + str;
  }